

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O3

void brotli::CopyCommandsToByteArray
               (Command *cmds,size_t num_commands,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *insert_and_copy_codes,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *distance_prefixes)

{
  iterator iVar1;
  uint16_t *__args;
  
  if (num_commands != 0) {
    __args = &cmds->cmd_prefix_;
    do {
      iVar1._M_current =
           (insert_and_copy_codes->
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (insert_and_copy_codes->
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)insert_and_copy_codes,
                   iVar1,__args);
      }
      else {
        *iVar1._M_current = *__args;
        (insert_and_copy_codes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
        ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      if ((*(uint32_t *)(__args + -8) != 0) && (0x7f < *__args)) {
        iVar1._M_current =
             (distance_prefixes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (distance_prefixes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>
                    ((vector<unsigned_short,std::allocator<unsigned_short>> *)distance_prefixes,
                     iVar1,__args + 1);
        }
        else {
          *iVar1._M_current = __args[1];
          (distance_prefixes->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
          _M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      __args = __args + 0xc;
      num_commands = num_commands - 1;
    } while (num_commands != 0);
  }
  return;
}

Assistant:

void CopyCommandsToByteArray(const Command* cmds,
                             const size_t num_commands,
                             std::vector<uint16_t>* insert_and_copy_codes,
                             std::vector<uint16_t>* distance_prefixes) {
  for (size_t i = 0; i < num_commands; ++i) {
    const Command& cmd = cmds[i];
    insert_and_copy_codes->push_back(cmd.cmd_prefix_);
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      distance_prefixes->push_back(cmd.dist_prefix_);
    }
  }
}